

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall
cmCPackGenerator::InstallProjectViaInstallCommands
          (cmCPackGenerator *this,bool setDestDir,string *tempInstallDirectory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmCPackLog *pcVar3;
  long *msg;
  undefined8 msg_00;
  bool bVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  pointer pbVar8;
  cmCPackGenerator *this_00;
  int retVal;
  string output;
  string tempInstallDirectoryEnv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installCommandsVector;
  string tmpFile;
  ostringstream cmCPackLog_msg;
  ostringstream cmCPackLog_msg_1;
  int local_49c;
  string local_498;
  string local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  cmCPackGenerator *local_438;
  long *local_430;
  long local_428;
  long local_420 [2];
  long *local_410;
  long local_400 [2];
  undefined1 local_3f0 [112];
  ios_base local_380 [472];
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  pcVar2 = local_3f0 + 0x10;
  local_3f0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"CPACK_INSTALL_COMMANDS","");
  local_438 = this;
  pcVar5 = GetOption(this,(string *)local_3f0);
  if ((pointer)local_3f0._0_8_ != pcVar2) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"CMAKE_INSTALL_PREFIX=","")
    ;
    std::__cxx11::string::_M_append
              ((char *)&local_478,(ulong)(tempInstallDirectory->_M_dataplus)._M_p);
    cmsys::SystemTools::PutEnv(&local_478);
    local_458.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_458.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_458.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3f0._0_8_ = pcVar2;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,pcVar5,pcVar5 + sVar6);
    cmSystemTools::ExpandListArgument((string *)local_3f0,&local_458,false);
    this_00 = local_438;
    if ((pointer)local_3f0._0_8_ != pcVar2) {
      operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
    }
    if (local_458.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_458.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      paVar1 = &local_498.field_2;
      pbVar8 = local_458.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"Execute: ",9);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_3f0,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length
                           );
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        pcVar3 = this_00->Logger;
        std::__cxx11::stringbuf::str();
        msg_00 = local_1a8._0_8_;
        sVar6 = strlen((char *)local_1a8._0_8_);
        cmCPackLog::Log(pcVar3,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x122,(char *)msg_00,sVar6);
        this_00 = local_438;
        if ((_func_int **)local_1a8._0_8_ != local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
        std::ios_base::~ios_base(local_380);
        local_498._M_string_length = 0;
        local_498.field_2._M_local_buf[0] = '\0';
        local_49c = 1;
        local_498._M_dataplus._M_p = (pointer)paVar1;
        bVar4 = cmSystemTools::RunSingleCommand
                          ((pbVar8->_M_dataplus)._M_p,&local_498,&local_498,&local_49c,(char *)0x0,
                           this_00->GeneratorVerbose,0.0);
        if (!bVar4 || local_49c != 0) {
          local_3f0._0_8_ = local_3f0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3f0,"CPACK_TOPLEVEL_DIRECTORY","");
          pcVar5 = GetOption(this_00,(string *)local_3f0);
          std::__cxx11::string::string((string *)&local_430,pcVar5,(allocator *)local_1a8);
          if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
            operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
          }
          std::__cxx11::string::append((char *)&local_430);
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)local_3f0,(char *)local_430,false);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,"# Run command: ",0xf);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_3f0,(pbVar8->_M_dataplus)._M_p,
                              pbVar8->_M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"# Output:",9);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          poVar7 = (ostream *)std::ostream::flush();
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_498._M_dataplus._M_p,local_498._M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Problem running install command: ",0x21);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(pbVar8->_M_dataplus)._M_p,
                              pbVar8->_M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Please check ",0xd);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_430,local_428);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," for errors",0xb);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar3 = this_00->Logger;
          std::__cxx11::stringbuf::str();
          msg = local_410;
          sVar6 = strlen((char *)local_410);
          cmCPackLog::Log(pcVar3,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x133,(char *)msg,sVar6);
          if (local_410 != local_400) {
            operator_delete(local_410,local_400[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_3f0);
          if (local_430 != local_420) {
            operator_delete(local_430,local_420[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != paVar1) {
            operator_delete(local_498._M_dataplus._M_p,
                            CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                                     local_498.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_458);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          return 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != paVar1) {
          operator_delete(local_498._M_dataplus._M_p,
                          CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                                   local_498.field_2._M_local_buf[0]) + 1);
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != local_458.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_458);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
  }
  return 1;
}

Assistant:

int cmCPackGenerator::InstallProjectViaInstallCommands(
  bool setDestDir, const std::string& tempInstallDirectory)
{
  (void) setDestDir;
  const char* installCommands = this->GetOption("CPACK_INSTALL_COMMANDS");
  if ( installCommands && *installCommands )
    {
    std::string tempInstallDirectoryEnv = "CMAKE_INSTALL_PREFIX=";
    tempInstallDirectoryEnv += tempInstallDirectory;
    cmSystemTools::PutEnv(tempInstallDirectoryEnv);
    std::vector<std::string> installCommandsVector;
    cmSystemTools::ExpandListArgument(installCommands,installCommandsVector);
    std::vector<std::string>::iterator it;
    for ( it = installCommandsVector.begin();
      it != installCommandsVector.end();
      ++it )
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << *it
        << std::endl);
      std::string output;
      int retVal = 1;
      bool resB = cmSystemTools::RunSingleCommand(
        it->c_str(), &output, &output,
        &retVal, 0, this->GeneratorVerbose, 0);
      if ( !resB || retVal )
        {
        std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
        tmpFile += "/InstallOutput.log";
        cmGeneratedFileStream ofs(tmpFile.c_str());
        ofs << "# Run command: " << *it << std::endl
          << "# Output:" << std::endl
          << output << std::endl;
        cmCPackLogger(cmCPackLog::LOG_ERROR,
          "Problem running install command: " << *it << std::endl
          << "Please check " << tmpFile << " for errors"
          << std::endl);
        return 0;
        }
      }
    }
  return 1;
}